

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase175::run(TestCase175 *this)

{
  uint *puVar1;
  Type local_85;
  uint local_84;
  bool local_7f;
  Type local_7e;
  Type local_7d;
  uint local_7c;
  bool _kj_shouldLog_1;
  bool local_76;
  Type local_75 [7];
  bool _kj_shouldLog;
  Type local_68;
  Function<void_()> local_58;
  undefined1 local_48 [8];
  Thread thread;
  undefined1 local_28 [7];
  bool initStarted;
  Lazy<unsigned_int> lazy;
  TestCase175 *this_local;
  
  lazy.value.ptr = (uint *)this;
  Lazy<unsigned_int>::Lazy((Lazy<unsigned_int> *)local_28);
  thread._23_1_ = 0;
  local_68.initStarted = (bool *)&thread.field_0x17;
  local_68.lazy = (Lazy<unsigned_int> *)local_28;
  Function<void()>::Function<kj::(anonymous_namespace)::TestCase175::run()::__0>
            ((Function<void()> *)&local_58,&local_68);
  Thread::Thread((Thread *)local_48,&local_58);
  Function<void_()>::~Function(&local_58);
  while (((thread._23_1_ ^ 0xff) & 1) != 0) {
    sched_yield();
  }
  puVar1 = Lazy<unsigned_int>::get<kj::(anonymous_namespace)::TestCase175::run()::__1>
                     ((Lazy<unsigned_int> *)local_28,local_75);
  if (*puVar1 != 0x7b) {
    local_76 = _::Debug::shouldLog(ERROR);
    while (local_76 != false) {
      local_7c = 0x7b;
      puVar1 = Lazy<unsigned_int>::get<kj::(anonymous_namespace)::TestCase175::run()::__2>
                         ((Lazy<unsigned_int> *)local_28,&local_7d);
      _::Debug::log<char_const(&)[98],unsigned_int,unsigned_int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/mutex-test.c++"
                 ,0xc4,ERROR,
                 "\"failed: expected \" \"(123u) == (lazy.get([](SpaceFor<uint>& space) { return space.construct(456); }))\", 123u, lazy.get([](SpaceFor<uint>& space) { return space.construct(456); })"
                 ,(char (*) [98])
                  "failed: expected (123u) == (lazy.get([](SpaceFor<uint>& space) { return space.construct(456); }))"
                 ,&local_7c,puVar1);
      local_76 = false;
    }
  }
  puVar1 = Lazy<unsigned_int>::get<kj::(anonymous_namespace)::TestCase175::run()::__3>
                     ((Lazy<unsigned_int> *)local_28,&local_7e);
  if (*puVar1 != 0x7b) {
    local_7f = _::Debug::shouldLog(ERROR);
    while (local_7f != false) {
      local_84 = 0x7b;
      puVar1 = Lazy<unsigned_int>::get<kj::(anonymous_namespace)::TestCase175::run()::__4>
                         ((Lazy<unsigned_int> *)local_28,&local_85);
      _::Debug::log<char_const(&)[98],unsigned_int,unsigned_int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/mutex-test.c++"
                 ,0xc5,ERROR,
                 "\"failed: expected \" \"(123u) == (lazy.get([](SpaceFor<uint>& space) { return space.construct(789); }))\", 123u, lazy.get([](SpaceFor<uint>& space) { return space.construct(789); })"
                 ,(char (*) [98])
                  "failed: expected (123u) == (lazy.get([](SpaceFor<uint>& space) { return space.construct(789); }))"
                 ,&local_84,puVar1);
      local_7f = false;
    }
  }
  Thread::~Thread((Thread *)local_48);
  Lazy<unsigned_int>::~Lazy((Lazy<unsigned_int> *)local_28);
  return;
}

Assistant:

TEST(Mutex, Lazy) {
  Lazy<uint> lazy;
  volatile bool initStarted = false;

  Thread thread([&]() {
    EXPECT_EQ(123u, lazy.get([&](SpaceFor<uint>& space) -> Own<uint> {
      initStarted = true;
      delay();
      return space.construct(123);
    }));
  });

  // Spin until the initializer has been entered in the thread.
  while (!initStarted) {
#if _WIN32
    Sleep(0);
#else
    sched_yield();
#endif
  }

  EXPECT_EQ(123u, lazy.get([](SpaceFor<uint>& space) { return space.construct(456); }));
  EXPECT_EQ(123u, lazy.get([](SpaceFor<uint>& space) { return space.construct(789); }));
}